

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDeferredTestReporter.cpp
# Opt level: O2

void __thiscall
UnitTest::anon_unknown_0::TestDeferredTestReporterFixtureReportFailureSavesFailureDetails::
~TestDeferredTestReporterFixtureReportFailureSavesFailureDetails
          (TestDeferredTestReporterFixtureReportFailureSavesFailureDetails *this)

{
  Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_FIXTURE(DeferredTestReporterFixture, ReportFailureSavesFailureDetails)
{
    char const* failure = "failure";

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, failure);

    DeferredTestResult const& result = reporter.GetResults().at(0);
    CHECK(result.failed == true);
    CHECK_EQUAL(fileName.c_str(), result.failureFile);
}